

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

short duckdb::TryCastCInternal<duckdb::uhugeint_t,short,duckdb::TryCast>
                (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  undefined8 in_RAX;
  bool in_R8B;
  uhugeint_t input;
  short result_value;
  short local_2;
  
  local_2 = (short)((ulong)in_RAX >> 0x30);
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.upper = (uint64_t)&local_2;
  input.lower = *(uint64_t *)((long)pvVar1 + row * 0x10 + 8);
  bVar2 = TryCast::Operation<duckdb::uhugeint_t,short>
                    (*(TryCast **)((long)pvVar1 + row * 0x10),input,(int16_t *)0x0,in_R8B);
  if (!bVar2) {
    local_2 = 0;
  }
  return local_2;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}